

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

CVmNetFile *
CVmObjFile::get_filename_and_access
          (vm_rcdesc *rc,int *access,int is_resource_file,os_filetype_t file_type,char *mime_type)

{
  int32_t iVar1;
  CVmNetFile *pCVar2;
  
  if (is_resource_file == 0) {
    if (*access == 0) {
      if (sp_[-2].typ == VM_INT) {
        iVar1 = sp_[-2].val.intval;
      }
      else {
        iVar1 = vm_val_t::nonint_num_to_int(sp_ + -2);
      }
      *access = iVar1;
      if (4 < iVar1) {
        err_throw(0x902);
      }
    }
  }
  else {
    *access = 1;
  }
  pCVar2 = get_filename_arg(sp_ + -1,rc,*access,is_resource_file,file_type,mime_type);
  return pCVar2;
}

Assistant:

CVmNetFile *CVmObjFile::get_filename_and_access(
    VMG_ const vm_rcdesc *rc, int *access, int is_resource_file,
    os_filetype_t file_type, const char *mime_type)
{
    /*
     *   If it's a resource file, the access mode is always READ, and there's
     *   no access mode argument.  If the caller provided a non-zero access
     *   mode, there's also no argument - we just use the caller's mode.  If
     *   the caller specified zero as the mode, it means we have to read the
     *   mode from an extra integer argument.  
     */
    if (is_resource_file)
    {
        /* resource file - the only access mode possible is READ */
        *access = VMOBJFILE_ACCESS_READ;
    }
    else if (*access == 0)
    {
        /* get the access mode from the stack */
        *access = G_stk->get(1)->num_to_int(vmg0_);

        /* make sure it's within the valid range for bytecode access codes */
        if (*access > VMOBJFILE_ACCESS_USERMAX)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* get the filename from the first argument */
    return get_filename_arg(
        vmg_ G_stk->get(0), rc, *access, is_resource_file,
        file_type, mime_type);
}